

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int sam_bam_cram_readrec(BGZF *bgzfp,void *fpv,void *bv,int *tid,int *beg,int *end)

{
  bam_seq_t *local_50;
  bam1_t *b;
  htsFile *fp;
  int *end_local;
  int *beg_local;
  int *tid_local;
  void *bv_local;
  void *fpv_local;
  BGZF *bgzfp_local;
  
  local_50 = (bam_seq_t *)bv;
  b = (bam1_t *)fpv;
  fp = (htsFile *)end;
  end_local = beg;
  beg_local = tid;
  tid_local = (int *)bv;
  bv_local = fpv;
  fpv_local = bgzfp;
  if (*(int *)((long)fpv + 0x44) == 4) {
    bgzfp_local._4_4_ = bam_read1(bgzfp,(bam1_t *)bv);
  }
  else {
    if (*(int *)((long)fpv + 0x44) != 6) {
      fprintf(_stderr,"[sam_bam_cram_readrec] Not implemented for SAM files -- Exiting\n");
      abort();
    }
    bgzfp_local._4_4_ = cram_get_bam_seq(*(cram_fd **)((long)fpv + 0x38),&local_50);
  }
  return bgzfp_local._4_4_;
}

Assistant:

static int sam_bam_cram_readrec(BGZF *bgzfp, void *fpv, void *bv, int *tid, int *beg, int *end)
{
    htsFile *fp = fpv;
    bam1_t *b = bv;
    switch (fp->format.format) {
    case bam:   return bam_read1(bgzfp, b);
    case cram:  return cram_get_bam_seq(fp->fp.cram, &b);
    default:
        // TODO Need headers available to implement this for SAM files
        fprintf(stderr, "[sam_bam_cram_readrec] Not implemented for SAM files -- Exiting\n");
        abort();
    }
}